

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregates.cpp
# Opt level: O3

void pbrt::anon_class_1_0_00000001::__invoke(StatsAccumulator *accum)

{
  long in_FS_OFFSET;
  
  StatsAccumulator::ReportCounter
            (accum,"Integrator/Camera rays traced",*(int64_t *)(in_FS_OFFSET + -0x2a0));
  *(undefined8 *)(in_FS_OFFSET + -0x2a0) = 0;
  return;
}

Assistant:

KdTreeAggregate::KdTreeAggregate(std::vector<PrimitiveHandle> p, int isectCost,
                                 int traversalCost, Float emptyBonus, int maxPrims,
                                 int maxDepth)
    : isectCost(isectCost),
      traversalCost(traversalCost),
      maxPrims(maxPrims),
      emptyBonus(emptyBonus),
      primitives(std::move(p)) {
    // Build kd-tree for accelerator
    nextFreeNode = nAllocedNodes = 0;
    if (maxDepth <= 0)
        maxDepth = std::round(8 + 1.3f * Log2Int(int64_t(primitives.size())));
    // Compute bounds for kd-tree construction
    std::vector<Bounds3f> primBounds;
    primBounds.reserve(primitives.size());
    for (PrimitiveHandle &prim : primitives) {
        Bounds3f b = prim.Bounds();
        bounds = Union(bounds, b);
        primBounds.push_back(b);
    }

    // Allocate working memory for kd-tree construction
    std::unique_ptr<BoundEdge[]> edges[3];
    for (int i = 0; i < 3; ++i)
        edges[i] = std::make_unique<BoundEdge[]>(2 * primitives.size());

    std::unique_ptr<int[]> prims0 = std::make_unique<int[]>(primitives.size());
    std::unique_ptr<int[]> prims1 =
        std::make_unique<int[]>((maxDepth + 1) * primitives.size());

    // Initialize _primNums_ for kd-tree construction
    std::unique_ptr<int[]> primNums = std::make_unique<int[]>(primitives.size());
    for (size_t i = 0; i < primitives.size(); ++i)
        primNums[i] = i;

    // Start recursive construction of kd-tree
    buildTree(0, bounds, primBounds, primNums.get(), primitives.size(), maxDepth, edges,
              prims0.get(), prims1.get(), 0);
}